

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForOneof
          (Generator *this,OneofDescriptor *oneof)

{
  int iVar1;
  string local_288;
  string local_268;
  string oneof_options;
  string oneof_name;
  SubstituteArg local_208;
  SubstituteArg local_1d8;
  SubstituteArg local_1a8;
  SubstituteArg local_178;
  SubstituteArg local_148;
  SubstituteArg local_118;
  SubstituteArg local_e8;
  SubstituteArg local_b8;
  SubstituteArg local_88;
  SubstituteArg local_58;
  
  MessageLite::SerializeAsString_abi_cxx11_((string *)&local_208,*(MessageLite **)(oneof + 0x18));
  OptionsValue(&oneof_options,this,(string *)&local_208);
  if (local_208.text_ != local_208.scratch_ + 4) {
    operator_delete(local_208.text_);
  }
  iVar1 = std::__cxx11::string::compare((char *)&oneof_options);
  if (iVar1 != 0) {
    local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"$0.$1[\'$2\']","");
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (&local_288,this,*(Descriptor **)(oneof + 0x10));
    local_208.text_ = local_288._M_dataplus._M_p;
    local_208.size_ = (int)local_288._M_string_length;
    local_58.text_ = "oneofs_by_name";
    local_58.size_ = 0xe;
    local_88.text_ = (char *)**(undefined8 **)(oneof + 8);
    local_88.size_ = *(int *)(*(undefined8 **)(oneof + 8) + 1);
    local_b8.text_ = (char *)0x0;
    local_b8.size_ = -1;
    local_e8.text_ = (char *)0x0;
    local_e8.size_ = -1;
    local_118.text_ = (char *)0x0;
    local_118.size_ = -1;
    local_148.text_ = (char *)0x0;
    local_148.size_ = -1;
    local_178.text_ = (char *)0x0;
    local_178.size_ = -1;
    local_1a8.text_ = (char *)0x0;
    local_1a8.size_ = -1;
    local_1d8.text_ = (char *)0x0;
    local_1d8.size_ = -1;
    strings::Substitute(&oneof_name,&local_268,&local_208,&local_58,&local_88,&local_b8,&local_e8,
                        &local_118,&local_148,&local_178,&local_1a8,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._M_dataplus._M_p != &local_268.field_2) {
      operator_delete(local_268._M_dataplus._M_p);
    }
    io::Printer::Print<char[11],std::__cxx11::string,char[17],std::__cxx11::string>
              (this->printer_,
               "$descriptor$._options = None\n$descriptor$._serialized_options = $serialized_value$\n"
               ,(char (*) [11])0x4488a1,&oneof_name,(char (*) [17])"serialized_value",&oneof_options
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)oneof_name._M_dataplus._M_p != &oneof_name.field_2) {
      operator_delete(oneof_name._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)oneof_options._M_dataplus._M_p != &oneof_options.field_2) {
    operator_delete(oneof_options._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Generator::FixOptionsForOneof(const OneofDescriptor& oneof) const {
  std::string oneof_options = OptionsValue(oneof.options().SerializeAsString());
  if (oneof_options != "None") {
    std::string oneof_name = strings::Substitute(
        "$0.$1['$2']", ModuleLevelDescriptorName(*oneof.containing_type()),
        "oneofs_by_name", oneof.name());
    PrintDescriptorOptionsFixingCode(oneof_name, oneof_options, printer_);
  }
}